

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadGlobalSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  uint index;
  char *format;
  uint uVar3;
  uint uVar4;
  bool mutable_;
  Index num_globals;
  Type global_type;
  bool local_3d;
  uint local_3c;
  Type local_38;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x24])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&local_3c,"global count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x25])(this->delegate_,(ulong)local_3c);
      if (iVar1 == 0) {
        if (local_3c != 0) {
          uVar3 = 0;
          do {
            uVar4 = this->num_global_imports_ + uVar3;
            RVar2 = ReadGlobalHeader(this,&local_38,&local_3d);
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x26])
                              (this->delegate_,(ulong)uVar4,local_38,(ulong)local_3d);
            if (iVar1 != 0) {
              format = "BeginGlobal callback failed";
              goto LAB_00180d02;
            }
            index = uVar4;
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x27])();
            if (iVar1 != 0) {
              format = "BeginGlobalInitExpr callback failed";
              goto LAB_00180d02;
            }
            RVar2 = ReadInitExpr(this,index);
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x28])
                              (this->delegate_,(ulong)uVar4);
            if (iVar1 != 0) {
              format = "EndGlobalInitExpr callback failed";
              goto LAB_00180d02;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x29])
                              (this->delegate_,(ulong)uVar4);
            if (iVar1 != 0) {
              format = "EndGlobal callback failed";
              goto LAB_00180d02;
            }
            uVar3 = uVar3 + 1;
          } while (local_3c != uVar3);
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2a])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        format = "EndGlobalSection callback failed";
      }
      else {
        format = "OnGlobalCount callback failed";
      }
LAB_00180d02:
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginGlobalSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadGlobalSection(Offset section_size) {
  CALLBACK(BeginGlobalSection, section_size);
  Index num_globals;
  CHECK_RESULT(ReadCount(&num_globals, "global count"));
  CALLBACK(OnGlobalCount, num_globals);
  for (Index i = 0; i < num_globals; ++i) {
    Index global_index = num_global_imports_ + i;
    Type global_type;
    bool mutable_;
    CHECK_RESULT(ReadGlobalHeader(&global_type, &mutable_));
    CALLBACK(BeginGlobal, global_index, global_type, mutable_);
    CALLBACK(BeginGlobalInitExpr, global_index);
    CHECK_RESULT(ReadInitExpr(global_index));
    CALLBACK(EndGlobalInitExpr, global_index);
    CALLBACK(EndGlobal, global_index);
  }
  CALLBACK0(EndGlobalSection);
  return Result::Ok;
}